

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int done_outputing_bits(Buffer *buffer)

{
  Buffer_t *pBVar1;
  Buffer *buffer_local;
  
  if (buffer->bits_to_go < 8) {
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)(buffer->bitbuffer << ((byte)buffer->bits_to_go & 0x1f));
  }
  return 0;
}

Assistant:

static void
done_outputing_bits(char *outfile)
{
	if(bits_to_go2 < 8) {
/*		putc(buffer2<<bits_to_go2,outfile); */

	        outfile[noutchar] = (buffer2<<bits_to_go2);
		if (noutchar < noutmax) noutchar++;

		/* count the garbage bits too */
		bitcount += bits_to_go2;
	}
}